

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

char * __thiscall fmt::v9::format_int::format_signed<int>(format_int *this,int value)

{
  char *pcVar1;
  uint value_00;
  
  value_00 = -value;
  if (0 < value) {
    value_00 = value;
  }
  pcVar1 = format_unsigned<unsigned_int>(this,value_00);
  if (value < 0) {
    pcVar1[-1] = '-';
    pcVar1 = pcVar1 + -1;
  }
  return pcVar1;
}

Assistant:

auto format_signed(Int value) -> char* {
    auto abs_value = static_cast<detail::uint32_or_64_or_128_t<Int>>(value);
    bool negative = value < 0;
    if (negative) abs_value = 0 - abs_value;
    auto begin = format_unsigned(abs_value);
    if (negative) *--begin = '-';
    return begin;
  }